

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CIfStm *statement)

{
  bool bVar1;
  pointer pIVar2;
  pointer pIVar3;
  CLabelStatement *pCVar4;
  CSeqStatement *pCVar5;
  CSeqStatement *pCVar6;
  pointer pIVar7;
  CJumpStatement *this_00;
  CStatementWrapper *this_01;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_268;
  CLabel local_260;
  CLabel local_240;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_220;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_218;
  undefined1 local_20a;
  undefined1 local_209;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_208;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_200;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_1f8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_1f0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_1e8;
  undefined1 local_1d9;
  CLabel local_1d8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_1b8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_1b0;
  unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> local_1a8 [15];
  undefined1 local_199;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_198;
  undefined1 local_18a;
  undefined1 local_189;
  CLabel local_188;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> local_168
  ;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> local_160
  ;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_158;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_150;
  unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> local_148 [14];
  undefined1 local_13a;
  undefined1 local_139;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_138;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_130;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_128;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_120;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_118;
  undefined1 local_109;
  CLabel local_108;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_e8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_e0;
  unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> local_d8 [15];
  undefined1 local_c9;
  CLabel local_c8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_a8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> suffix;
  CLabel labelJoin;
  CLabel labelFalse;
  CLabel labelTrue;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperTargetNegative
  ;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperTargetPositive
  ;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> local_20;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperCondition;
  CIfStm *statement_local;
  CBuildVisitor *this_local;
  
  wrapperCondition._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
       )(__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
         )statement;
  std::operator<<((ostream *)&std::cout,"IRT builder: CIfStm\n");
  pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                     ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                      ((long)wrapperCondition._M_t.
                             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl +
                      0x18));
  (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::unique_ptr
            (&local_20,&this->wrapper);
  pIVar3 = std::unique_ptr<IStatement,_std::default_delete<IStatement>_>::operator->
                     ((unique_ptr<IStatement,_std::default_delete<IStatement>_> *)
                      ((long)wrapperCondition._M_t.
                             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl +
                      0x20));
  (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::unique_ptr
            (&wrapperTargetNegative,&this->wrapper);
  pIVar3 = std::unique_ptr<IStatement,_std::default_delete<IStatement>_>::operator->
                     ((unique_ptr<IStatement,_std::default_delete<IStatement>_> *)
                      ((long)wrapperCondition._M_t.
                             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl +
                      0x28));
  (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::unique_ptr
            ((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> *)
             &labelTrue.field_0x18,&this->wrapper);
  bVar1 = std::operator!=(&wrapperTargetNegative,(nullptr_t)0x0);
  if (!bVar1) {
    __assert_fail("wrapperTargetPositive != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                  ,0x187,"virtual void CBuildVisitor::Visit(CIfStm &)");
  }
  bVar1 = std::operator!=((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                           *)&labelTrue.field_0x18,(nullptr_t)0x0);
  if (!bVar1) {
    __assert_fail("wrapperTargetNegative != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                  ,0x188,"virtual void CBuildVisitor::Visit(CIfStm &)");
  }
  IRT::CLabel::CLabel((CLabel *)&labelFalse.field_0x18);
  IRT::CLabel::CLabel((CLabel *)&labelJoin.field_0x18);
  IRT::CLabel::CLabel((CLabel *)&suffix);
  pCVar4 = (CLabelStatement *)operator_new(0x28);
  local_c9 = 1;
  IRT::CLabel::CLabel(&local_c8,(CLabel *)&suffix);
  IRT::CLabelStatement::CLabelStatement(pCVar4,&local_c8);
  local_c9 = 0;
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_a8,(pointer)pCVar4);
  IRT::CLabel::~CLabel(&local_c8);
  pCVar5 = (CSeqStatement *)operator_new(0x18);
  local_13a = 1;
  pCVar4 = (CLabelStatement *)operator_new(0x28);
  local_109 = 1;
  IRT::CLabel::CLabel(&local_108,(CLabel *)&labelJoin.field_0x18);
  IRT::CLabelStatement::CLabelStatement(pCVar4,&local_108);
  local_109 = 0;
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_e8,(pointer)pCVar4);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_e0,&local_e8);
  pCVar6 = (CSeqStatement *)operator_new(0x18);
  local_139 = 1;
  pIVar7 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                       *)&labelTrue.field_0x18);
  (*pIVar7->_vptr_ISubtreeWrapper[1])(&local_130);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_128,&local_130);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_138,&local_a8);
  IRT::CSeqStatement::CSeqStatement(pCVar6,&local_128,&local_138);
  local_139 = 0;
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_120,(pointer)pCVar6);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_118,&local_120);
  IRT::CSeqStatement::CSeqStatement(pCVar5,&local_e0,&local_118);
  local_13a = 0;
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>(local_d8,(pointer)pCVar5);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
            (&local_a8,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             local_d8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             local_d8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_118);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_120);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_138);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_128);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_130);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_e0);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_e8);
  IRT::CLabel::~CLabel(&local_108);
  pCVar5 = (CSeqStatement *)operator_new(0x18);
  local_199 = 1;
  this_00 = (CJumpStatement *)operator_new(0x10);
  local_18a = 1;
  pCVar4 = (CLabelStatement *)operator_new(0x28);
  local_189 = 1;
  IRT::CLabel::CLabel(&local_188,(CLabel *)&suffix);
  IRT::CLabelStatement::CLabelStatement(pCVar4,&local_188);
  local_189 = 0;
  std::unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>::
  unique_ptr<std::default_delete<IRT::CLabelStatement_const>,void>
            ((unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>
              *)&local_168,pCVar4);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  unique_ptr(&local_160,&local_168);
  IRT::CJumpStatement::CJumpStatement(this_00,&local_160);
  local_18a = 0;
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_158,(pointer)this_00);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_150,&local_158);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_198,&local_a8);
  IRT::CSeqStatement::CSeqStatement(pCVar5,&local_150,&local_198);
  local_199 = 0;
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>(local_148,(pointer)pCVar5);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
            (&local_a8,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             local_148);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             local_148);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_198);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_150);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_158);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr(&local_160);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr(&local_168);
  IRT::CLabel::~CLabel(&local_188);
  pCVar5 = (CSeqStatement *)operator_new(0x18);
  local_20a = 1;
  pCVar4 = (CLabelStatement *)operator_new(0x28);
  local_1d9 = 1;
  IRT::CLabel::CLabel(&local_1d8,(CLabel *)&labelFalse.field_0x18);
  IRT::CLabelStatement::CLabelStatement(pCVar4,&local_1d8);
  local_1d9 = 0;
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_1b8,(pointer)pCVar4);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_1b0,&local_1b8);
  pCVar6 = (CSeqStatement *)operator_new(0x18);
  local_209 = 1;
  pIVar7 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->(&wrapperTargetNegative);
  (*pIVar7->_vptr_ISubtreeWrapper[1])(&local_200);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_1f8,&local_200);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_208,&local_a8);
  IRT::CSeqStatement::CSeqStatement(pCVar6,&local_1f8,&local_208);
  local_209 = 0;
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_1f0,(pointer)pCVar6);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_1e8,&local_1f0);
  IRT::CSeqStatement::CSeqStatement(pCVar5,&local_1b0,&local_1e8);
  local_20a = 0;
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>(local_1a8,(pointer)pCVar5);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
            (&local_a8,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             local_1a8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             local_1a8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_1e8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_1f0);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_208);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_1f8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_200);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_1b0);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_1b8);
  IRT::CLabel::~CLabel(&local_1d8);
  this_01 = (CStatementWrapper *)operator_new(0x10);
  pCVar5 = (CSeqStatement *)operator_new(0x18);
  pIVar7 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->(&local_20);
  IRT::CLabel::CLabel(&local_240,(CLabel *)&labelFalse.field_0x18);
  IRT::CLabel::CLabel(&local_260,(CLabel *)&labelJoin.field_0x18);
  (*pIVar7->_vptr_ISubtreeWrapper[2])(&local_220,pIVar7,&local_240,&local_260);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_218,&local_220);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_268,&local_a8);
  IRT::CSeqStatement::CSeqStatement(pCVar5,&local_218,&local_268);
  IRT::CStatementWrapper::CStatementWrapper(this_01,(CStatement *)pCVar5);
  updateSubtreeWrapper(this,(ISubtreeWrapper *)this_01);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_268);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_218);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_220);
  IRT::CLabel::~CLabel(&local_260);
  IRT::CLabel::~CLabel(&local_240);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_a8);
  IRT::CLabel::~CLabel((CLabel *)&suffix);
  IRT::CLabel::~CLabel((CLabel *)&labelJoin.field_0x18);
  IRT::CLabel::~CLabel((CLabel *)&labelFalse.field_0x18);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            ((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> *)
             &labelTrue.field_0x18);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&wrapperTargetNegative);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void CBuildVisitor::Visit( CIfStm &statement ) {
    std::cout << "IRT builder: CIfStm\n";
    statement.conditionExpression->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperCondition = std::move( wrapper );
    statement.positiveStatement->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperTargetPositive = std::move( wrapper );
    statement.negativeStatement->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperTargetNegative = std::move( wrapper );

    assert( wrapperTargetPositive != nullptr );
    assert( wrapperTargetNegative != nullptr );

    IRT::CLabel labelTrue;
    IRT::CLabel labelFalse;
    IRT::CLabel labelJoin;

    std::unique_ptr<const IRT::CStatement> suffix( new IRT::CLabelStatement( labelJoin ));

    suffix = std::move( std::unique_ptr<const IRT::CStatement>(
            new IRT::CSeqStatement(
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CLabelStatement( labelFalse ))),
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                            std::move( wrapperTargetNegative->ToStatement( )),
                            std::move( suffix )
                    )))
            )
    ));

    suffix = std::move( std::unique_ptr<const IRT::CStatement>(
            new IRT::CSeqStatement(
                    std::move( std::unique_ptr<const IRT::CStatement>(
                            new IRT::CJumpStatement( std::move( std::unique_ptr<const IRT::CLabelStatement>(
                                    new IRT::CLabelStatement(
                                            labelJoin
                                    )
                            )))
                    )),
                    std::move( suffix )
            )
    ));

    suffix = std::move( std::unique_ptr<const IRT::CStatement>(
            new IRT::CSeqStatement(
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CLabelStatement( labelTrue ))),
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                            std::move( wrapperTargetPositive->ToStatement( )),
                            std::move( suffix )
                    )))
            )
    ));

    updateSubtreeWrapper( new IRT::CStatementWrapper(
            new IRT::CSeqStatement(
                    std::move( wrapperCondition->ToConditional( labelTrue, labelFalse )),
                    std::move( suffix )
            )
    ));
}